

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O0

bool __thiscall QTextEdit::event(QTextEdit *this,QEvent *e)

{
  bool bVar1;
  byte bVar2;
  Type TVar3;
  Reason RVar4;
  QTextEditPrivate *this_00;
  QEvent *in_RSI;
  QTextEdit *in_RDI;
  long in_FS_OFFSET;
  bool result;
  QTextEditPrivate *d;
  QPoint cursorPos;
  QContextMenuEvent ce;
  undefined4 in_stack_ffffffffffffff48;
  KeyboardModifier in_stack_ffffffffffffff4c;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  QPoint *in_stack_ffffffffffffff58;
  QWidget *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff74;
  bool local_6d;
  uint local_6c;
  QPoint local_68;
  QRect local_60;
  QPoint local_50;
  QContextMenuEvent local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QTextEdit *)0x6d2605);
  TVar3 = QEvent::type(in_RSI);
  if (TVar3 - WindowActivate < 2) {
    QWidget::palette((QWidget *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
    QWidgetTextControl::setPalette
              ((QWidgetTextControl *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
               (QPalette *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  }
  else if (TVar3 == ShortcutOverride) {
LAB_006d264b:
    QTextEditPrivate::sendControlEvent(this_00,(QEvent *)CONCAT44(in_stack_ffffffffffffff74,TVar3));
  }
  else if (TVar3 == ContextMenu) {
    RVar4 = QContextMenuEvent::reason((QContextMenuEvent *)in_RSI);
    if (RVar4 == Keyboard) {
      ensureCursorVisible((QTextEdit *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50)
                         );
      local_50 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
      local_60 = cursorRect(in_RDI);
      local_50 = QRect::center((QRect *)CONCAT44(in_stack_ffffffffffffff74,TVar3));
      memset(local_48,0xaa,0x40);
      local_68 = QWidget::mapToGlobal(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      QFlags<Qt::KeyboardModifier>::QFlags
                ((QFlags<Qt::KeyboardModifier> *)
                 CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff4c);
      QContextMenuEvent::QContextMenuEvent
                (local_48,Keyboard,(QPoint *)&local_50,(QPoint *)&local_68,
                 (QFlags_conflict1 *)(ulong)local_6c);
      bVar1 = QEvent::isAccepted(in_RSI);
      QEvent::setAccepted((QEvent *)local_48,bVar1);
      bVar2 = QAbstractScrollArea::event((QAbstractScrollArea *)e,(QEvent *)d);
      bVar1 = QEvent::isAccepted((QEvent *)local_48);
      (**(code **)(*(long *)in_RSI + 0x10))(in_RSI,bVar1);
      local_6d = (bool)(bVar2 & 1);
      QContextMenuEvent::~QContextMenuEvent(local_48);
      goto LAB_006d27b9;
    }
  }
  else if (TVar3 == ToolTip) goto LAB_006d264b;
  local_6d = QAbstractScrollArea::event((QAbstractScrollArea *)e,(QEvent *)d);
LAB_006d27b9:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_6d;
}

Assistant:

bool QTextEdit::event(QEvent *e)
{
    Q_D(QTextEdit);
    switch (e->type()) {
    case QEvent::ShortcutOverride:
    case QEvent::ToolTip:
        d->sendControlEvent(e);
        break;
    case QEvent::WindowActivate:
    case QEvent::WindowDeactivate:
        d->control->setPalette(palette());
        break;
#ifndef QT_NO_CONTEXTMENU
    case QEvent::ContextMenu:
        if (static_cast<QContextMenuEvent *>(e)->reason() == QContextMenuEvent::Keyboard) {
            ensureCursorVisible();
            const QPoint cursorPos = cursorRect().center();
            QContextMenuEvent ce(QContextMenuEvent::Keyboard, cursorPos, d->viewport->mapToGlobal(cursorPos));
            ce.setAccepted(e->isAccepted());
            const bool result = QAbstractScrollArea::event(&ce);
            e->setAccepted(ce.isAccepted());
            return result;
        }
        break;
#endif // QT_NO_CONTEXTMENU
#ifdef QT_KEYPAD_NAVIGATION
    case QEvent::EnterEditFocus:
    case QEvent::LeaveEditFocus:
        if (QApplicationPrivate::keypadNavigationEnabled())
            d->sendControlEvent(e);
        break;
#endif
    default:
        break;
    }
    return QAbstractScrollArea::event(e);
}